

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O2

void __thiscall
vkt::Draw::FramebufferCreateInfo::FramebufferCreateInfo
          (FramebufferCreateInfo *this,VkRenderPass _renderPass,
          vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
          *atachments,deUint32 _width,deUint32 _height,deUint32 _layers)

{
  pointer pHVar1;
  deUint32 dVar2;
  
  (this->super_VkFramebufferCreateInfo).sType = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
  (this->super_VkFramebufferCreateInfo).pNext = (void *)0x0;
  (this->super_VkFramebufferCreateInfo).flags = 0;
  (this->super_VkFramebufferCreateInfo).renderPass.m_internal = _renderPass.m_internal;
  pHVar1 = (atachments->
           super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  dVar2 = (deUint32)
          ((ulong)((long)(atachments->
                         super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)pHVar1) >> 3);
  (this->super_VkFramebufferCreateInfo).attachmentCount = dVar2;
  if (dVar2 != 0) {
    (this->super_VkFramebufferCreateInfo).pAttachments = pHVar1;
  }
  (this->super_VkFramebufferCreateInfo).width = _width;
  (this->super_VkFramebufferCreateInfo).height = _height;
  (this->super_VkFramebufferCreateInfo).layers = _layers;
  return;
}

Assistant:

FramebufferCreateInfo::FramebufferCreateInfo (vk::VkRenderPass						_renderPass,
											  const std::vector<vk::VkImageView>&	atachments,
											  deUint32								_width,
											  deUint32								_height,
											  deUint32								_layers)
{
	sType = vk::VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
	pNext = DE_NULL;
	flags = 0u;

	renderPass		= _renderPass;
	attachmentCount	= static_cast<deUint32>(atachments.size());

	if (attachmentCount)
	{
		pAttachments = const_cast<vk::VkImageView *>(&atachments[0]);
	}

	width	= _width;
	height	= _height;
	layers	= _layers;
}